

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O0

int dwarf_loclist_from_expr_c
              (Dwarf_Debug dbg,Dwarf_Ptr expression_in,Dwarf_Unsigned expression_length,
              Dwarf_Half address_size,Dwarf_Half offset_size,Dwarf_Half dwarf_version,
              Dwarf_Loc_Head_c *loc_head,Dwarf_Unsigned *listlen,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Addr highpc;
  Dwarf_Loc_Head_c loc_head_00;
  Dwarf_Locdesc_c space;
  int res;
  Dwarf_Half version_stamp;
  Dwarf_Addr rawhighpc;
  Dwarf_Addr rawlowpc;
  int local_listlen;
  Dwarf_Locdesc_c_conflict llbuf;
  Dwarf_Loc_Head_c llhead;
  Dwarf_Block_c loc_block;
  Dwarf_Half dwarf_version_local;
  Dwarf_Half offset_size_local;
  Dwarf_Half address_size_local;
  Dwarf_Unsigned expression_length_local;
  Dwarf_Ptr expression_in_local;
  Dwarf_Debug dbg_local;
  
  highpc = 0xffffffff;
  if (address_size == 8) {
    highpc = 0xffffffffffffffff;
  }
  loc_block.bl_locdesc_offset._2_2_ = dwarf_version;
  loc_block.bl_locdesc_offset._4_2_ = offset_size;
  loc_block.bl_locdesc_offset._6_2_ = address_size;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_loclist_from_expr_c()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    loc_head_00 = (Dwarf_Loc_Head_c)_dwarf_get_alloc(dbg,';',1);
    if (loc_head_00 == (Dwarf_Loc_Head_c)0x0) {
      _dwarf_error(dbg,error,0x3e);
      dbg_local._4_4_ = 1;
    }
    else {
      loc_head_00->ll_magic = 0xadab4;
      memset(&llhead,0,0x28);
      loc_block.bl_data._0_2_ = 0;
      loc_block.bl_kind = 0;
      loc_block._18_6_ = 0;
      loc_block.bl_section_offset = 0;
      llhead = (Dwarf_Loc_Head_c)expression_length;
      loc_block.bl_len = (Dwarf_Unsigned)expression_in;
      space = (Dwarf_Locdesc_c)_dwarf_get_alloc(dbg,':',1);
      if (space == (Dwarf_Locdesc_c)0x0) {
        dwarf_dealloc_loc_head_c(loc_head_00);
        _dwarf_error(dbg,error,0x3e);
        dbg_local._4_4_ = 1;
      }
      else {
        space->ld_magic = 0xadab4;
        loc_head_00->ll_locdesc = space;
        loc_head_00->ll_locdesc_count = 1;
        loc_head_00->ll_context = (Dwarf_CU_Context)0x0;
        loc_head_00->ll_dbg = dbg;
        loc_head_00->ll_lkind = 0;
        iVar1 = _dwarf_fill_in_locdesc_op_c
                          (dbg,0,loc_head_00,(Dwarf_Block_c *)&llhead,
                           loc_block.bl_locdesc_offset._6_2_,loc_block.bl_locdesc_offset._4_2_,
                           dwarf_version,0,highpc,0,error);
        if (iVar1 == 0) {
          *loc_head = loc_head_00;
          *listlen = 1;
          dbg_local._4_4_ = 0;
        }
        else {
          dwarf_dealloc(dbg,space,0x3a);
          loc_head_00->ll_locdesc = (Dwarf_Locdesc_c)0x0;
          loc_head_00->ll_locdesc_count = 0;
          dwarf_dealloc_loc_head_c(loc_head_00);
          dbg_local._4_4_ = 1;
        }
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_loclist_from_expr_c(Dwarf_Debug dbg,
    Dwarf_Ptr expression_in,
    Dwarf_Unsigned expression_length,
    Dwarf_Half address_size,
    Dwarf_Half offset_size,
    Dwarf_Half dwarf_version,
    Dwarf_Loc_Head_c *loc_head,
    Dwarf_Unsigned * listlen,
    Dwarf_Error * error)
{
    /* Dwarf_Block that describes a single location expression. */
    Dwarf_Block_c loc_block;
    Dwarf_Loc_Head_c llhead = 0;
    Dwarf_Locdesc_c llbuf = 0;
    int local_listlen = 1;
    Dwarf_Addr rawlowpc = 0;
    Dwarf_Addr rawhighpc = MAX_ADDR;
    Dwarf_Half version_stamp = dwarf_version;
    int res = 0;

    CHECK_DBG(dbg,error,"dwarf_loclist_from_expr_c()");
    llhead = (Dwarf_Loc_Head_c)_dwarf_get_alloc(dbg,
        DW_DLA_LOC_HEAD_C, 1);
    if (!llhead) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    llhead->ll_magic = LOCLISTS_MAGIC;
    memset(&loc_block,0,sizeof(loc_block));
    loc_block.bl_len = expression_length;
    loc_block.bl_data = expression_in;
    loc_block.bl_kind = DW_LKIND_expression; /* Not from loclist. */
    loc_block.bl_section_offset = 0; /* Fake. Not meaningful. */
    loc_block.bl_locdesc_offset = 0; /* Fake. Not meaningful. */
    llbuf = (Dwarf_Locdesc_c)
        _dwarf_get_alloc(dbg, DW_DLA_LOCDESC_C, local_listlen);
    if (!llbuf) {
        dwarf_dealloc_loc_head_c(llhead);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    llbuf->ld_magic = LOCLISTS_MAGIC;
    llhead->ll_locdesc = llbuf;
    llhead->ll_locdesc_count = local_listlen;
    llhead->ll_context = 0; /* Not available! */
    llhead->ll_dbg = dbg;
    llhead->ll_lkind = DW_LKIND_expression;

    /*  An empty location description (block length 0)
        means the code generator emitted no variable,
        the variable was not generated,
        it was unused or perhaps never tested
        after being set. Dwarf2,
        section 2.4.1 In other words, it is not
        an error, and we don't
        test for block length 0 specially here.  */

    /* Fills in the locdesc and its operators list at index 0 */
    res = _dwarf_fill_in_locdesc_op_c(dbg,
        0,
        llhead,
        &loc_block,
        address_size,
        offset_size,
        version_stamp,
        rawlowpc,
        rawhighpc,
        DW_LKIND_expression,
        error);
    if (res != DW_DLV_OK) {
        /* low level error already set: let it be passed back */
        dwarf_dealloc(dbg,llbuf,DW_DLA_LOCDESC_C);
        llhead->ll_locdesc = 0;
        llhead->ll_locdesc_count = 0;
        dwarf_dealloc_loc_head_c(llhead);
        return DW_DLV_ERROR;
    }
    *loc_head = llhead;
    *listlen = local_listlen;
    return DW_DLV_OK;
}